

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.hpp
# Opt level: O2

X86Mem __thiscall Centaurus::MyConstPool::add(MyConstPool *this,Data128 data)

{
  undefined8 extraout_RDX;
  X86Mem XVar1;
  size_t offset;
  Data128 data_local;
  
  data_local.sq[0] = data.sq[1];
  asmjit::ConstPool::add((ConstPool *)(data.sq[0] + 0x28),&data_local,0x10,&offset);
  this->m_as = (X86Assembler *)0xa;
  *(undefined4 *)((long)&(this->m_zone)._ptr + 4) = *(undefined4 *)(data.sq[0] + 0x10c);
  *(undefined4 *)&(this->m_zone)._ptr = (undefined4)offset;
  XVar1.super_Mem.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)extraout_RDX;
  XVar1.super_Mem.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)this;
  return (X86Mem)XVar1.super_Mem.super_Operand.super_Operand_.field_0;
}

Assistant:

asmjit::X86Mem add(asmjit::Data128 data)
    {
        size_t offset;
        m_pool.add(&data, 16, offset);

        return asmjit::X86Mem(m_label, offset);
    }